

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomNurbsCurves>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               GeomNurbsCurves *curves,string *warn,string *err,PrimReconstructOptions *options)

{
  long *plVar1;
  _Rb_tree_node_base *__k;
  _Base_ptr p_Var2;
  undefined8 uVar3;
  size_type sVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined7 extraout_var;
  ostream *poVar8;
  long *plVar9;
  const_iterator cVar10;
  mapped_type *this;
  _Rb_tree_node_base *p_Var11;
  undefined8 uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  storage_t<double> __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  anon_struct_8_0_00000001_for___align aVar13;
  Property *pPVar14;
  char cVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_> dst;
  ParseResult ret;
  optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_> pv;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined4 in_stack_fffffffffffffadc;
  undefined1 local_520 [8];
  char *local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  string local_4f8;
  TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
  local_4d8;
  undefined1 local_4b0 [8];
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_498;
  pointer local_488;
  _Alloc_hider _Stack_480;
  size_type sStack_478;
  bool abStack_470 [16];
  storage_union local_460;
  AttrMetas *local_450;
  GeomNurbsCurves *local_448;
  pointer local_440;
  char local_438;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_430;
  undefined1 local_418 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  undefined1 local_3e8 [24];
  undefined1 local_3d0 [48];
  optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
  local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  string *local_348;
  storage_t<tinyusdz::Token> local_340;
  string *local_320;
  storage_t<tinyusdz::Token> local_318;
  undefined1 local_2f8 [8];
  undefined1 local_2f0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [2];
  undefined8 local_2c8;
  undefined1 auStack_2c0 [56];
  ios_base local_288 [16];
  ios_base local_278 [264];
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  string local_150 [16];
  undefined1 local_140 [32];
  undefined8 local_120 [2];
  pointer local_110 [2];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined8 local_c0 [2];
  string local_b0 [16];
  undefined8 local_a0 [2];
  string local_90 [16];
  undefined8 local_80 [2];
  storage_t<double> local_70 [2];
  storage_t<tinyusdz::Token> local_60;
  _Alloc_hider local_40 [2];
  
  local_3d0._24_8_ = (long)local_3d0 + 8;
  local_3d0._8_4_ = _S_red;
  local_3d0._16_8_ = (_Link_type)0x0;
  local_440 = (pointer)0x0;
  local_3d0._40_8_ = 0;
  uVar6 = (uint)options->strict_allowedToken_check;
  abStack_470._8_8_ = err;
  local_448 = curves;
  local_3e8._16_8_ = warn;
  local_3d0._32_8_ = local_3d0._24_8_;
  bVar5 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_3d0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&curves->super_GPrim,warn,err,options->strict_allowedToken_check)
  ;
  if (bVar5) {
    p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_318._24_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    local_440 = (pointer)CONCAT71(extraout_var,p_Var11 == (_Rb_tree_node_base *)local_318._24_8_);
    if (p_Var11 != (_Rb_tree_node_base *)local_318._24_8_) {
      local_318._16_8_ = &local_448->curveVertexCounts;
      local_318._8_8_ = &local_448->points;
      local_318.data._0_8_ = (undefined8)&local_448->velocities;
      local_320 = (string *)&local_448->normals;
      local_340._24_8_ = &local_448->accelerations;
      local_340._16_8_ = &local_448->widths;
      local_340._8_8_ = &local_448->order;
      local_340.data._0_8_ = (undefined8)&local_448->knots;
      local_450 = &(local_448->ranges)._metas;
      local_350 = &(local_448->ranges)._paths;
      local_360 = &(local_448->ranges)._attrib;
      local_348 = (string *)&local_448->pointWeights;
      local_358 = &(local_448->super_GPrim).props;
      do {
        local_70[0] = (storage_t<double>)&local_60;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        local_2f8 = (undefined1  [8])(local_2f0 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2f8,"curveVertexCounts","");
        pPVar14 = (Property *)local_2f8;
        local_460.dynamic = (Property *)(p_Var11 + 2);
        (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                  ((ParseResult *)local_4b0,(_anonymous_namespace_ *)local_3d0,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,(string *)(p_Var11 + 2),(Property *)local_2f8,
                   (string *)local_318._16_8_,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *
                   )CONCAT44(in_stack_fffffffffffffadc,uVar6));
        if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
          operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
        }
        if (local_70[0] != (storage_t<double>)&local_60) {
          operator_delete((void *)local_70[0],(long)local_60.data._0_8_ + 1);
        }
        iVar7 = 0;
        if (((ulong)local_4b0 & 0xfffffffd) == 0) {
          iVar7 = 3;
LAB_001ff506:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_4b0._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2f8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2f8,0xc60);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_520 = (undefined1  [8])&local_510;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_520,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[18],std::__cxx11::string>
                      (&local_4f8,(fmt *)local_520,(string *)"curveVertexCounts",
                       (char (*) [18])local_4a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar14)
            ;
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2f8,local_4f8._M_dataplus._M_p,
                                CONCAT62(local_4f8._M_string_length._2_6_,
                                         (undefined2)local_4f8._M_string_length));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
              operator_delete(local_4f8._M_dataplus._M_p,
                              CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                       local_4f8.field_2._M_allocated_capacity._0_2_) + 1);
            }
            uVar12 = abStack_470._8_8_;
            if (local_520 != (undefined1  [8])&local_510) {
              operator_delete((void *)local_520,(ulong)(local_510._M_allocated_capacity + 1));
            }
            if ((string *)uVar12 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar9 = (long *)::std::__cxx11::string::_M_append(local_520,*(ulong *)uVar12);
              plVar1 = plVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar1) {
                local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                local_4f8.field_2._M_allocated_capacity._2_6_ = (undefined6)((ulong)*plVar1 >> 0x10)
                ;
                local_4f8.field_2._8_2_ = (undefined2)plVar9[3];
                local_4f8.field_2._10_6_ = (undefined6)((ulong)plVar9[3] >> 0x10);
                local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
              }
              else {
                local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                local_4f8.field_2._M_allocated_capacity._2_6_ = (undefined6)((ulong)*plVar1 >> 0x10)
                ;
                local_4f8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_4f8._M_string_length._0_2_ = (undefined2)plVar9[1];
              local_4f8._M_string_length._2_6_ = (undefined6)((ulong)plVar9[1] >> 0x10);
              *plVar9 = (long)plVar1;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)uVar12,(string *)&local_4f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                operator_delete(local_4f8._M_dataplus._M_p,
                                CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                         local_4f8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              if (local_520 != (undefined1  [8])&local_510) {
                operator_delete((void *)local_520,(ulong)(local_510._M_allocated_capacity + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
            ::std::ios_base::~ios_base(local_288);
            iVar7 = 1;
            goto LAB_001ff506;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._0_8_ != &aStack_498) {
          operator_delete((void *)local_4a8._0_8_,aStack_498._M_allocated_capacity + 1);
        }
        if (bVar5) {
          local_90._0_8_ = local_80;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_90,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_2f8 = (undefined1  [8])(local_2f0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"points","");
          pPVar14 = (Property *)local_2f8;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                    ((ParseResult *)local_4b0,(_anonymous_namespace_ *)local_3d0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_90,(string *)local_460.dynamic,(Property *)local_2f8,
                     (string *)local_318._8_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffadc,uVar6));
          if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
            operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
          }
          if ((undefined8 *)local_90._0_8_ != local_80) {
            operator_delete((void *)local_90._0_8_,(ulong)(local_80[0] + 1));
          }
          iVar7 = 0;
          if (((ulong)local_4b0 & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_001ff812:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_4b0._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2f8,0xc61);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_520 = (undefined1  [8])&local_510;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_520,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[7],std::__cxx11::string>
                        (&local_4f8,(fmt *)local_520,(string *)"points",(char (*) [7])local_4a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_2f8,local_4f8._M_dataplus._M_p,
                                  CONCAT62(local_4f8._M_string_length._2_6_,
                                           (undefined2)local_4f8._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                operator_delete(local_4f8._M_dataplus._M_p,
                                CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                         local_4f8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              uVar12 = abStack_470._8_8_;
              if (local_520 != (undefined1  [8])&local_510) {
                operator_delete((void *)local_520,(ulong)(local_510._M_allocated_capacity + 1));
              }
              if ((string *)uVar12 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar9 = (long *)::std::__cxx11::string::_M_append(local_520,*(ulong *)uVar12);
                plVar1 = plVar9 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar1) {
                  local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_4f8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_4f8.field_2._8_2_ = (undefined2)plVar9[3];
                  local_4f8.field_2._10_6_ = (undefined6)((ulong)plVar9[3] >> 0x10);
                  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                }
                else {
                  local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_4f8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_4f8._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_4f8._M_string_length._0_2_ = (undefined2)plVar9[1];
                local_4f8._M_string_length._2_6_ = (undefined6)((ulong)plVar9[1] >> 0x10);
                *plVar9 = (long)plVar1;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)uVar12,(string *)&local_4f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                  operator_delete(local_4f8._M_dataplus._M_p,
                                  CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                           local_4f8.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_520 != (undefined1  [8])&local_510) {
                  operator_delete((void *)local_520,(ulong)(local_510._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
              ::std::ios_base::~ios_base(local_288);
              iVar7 = 1;
              goto LAB_001ff812;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._0_8_ != &aStack_498) {
            operator_delete((void *)local_4a8._0_8_,aStack_498._M_allocated_capacity + 1);
          }
          if (bVar5) {
            local_b0._0_8_ = local_a0;
            ::std::__cxx11::string::_M_construct<char*>
                      (local_b0,*(long *)(p_Var11 + 1),
                       (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
            local_2f8 = (undefined1  [8])(local_2f0 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"velocities","");
            pPVar14 = (Property *)local_2f8;
            (anonymous_namespace)::
            ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                      ((ParseResult *)local_4b0,(_anonymous_namespace_ *)local_3d0,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_b0,(string *)local_460.dynamic,(Property *)local_2f8,
                       (string *)local_318.data._0_8_,
                       (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffadc,uVar6));
            if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
              operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
            }
            if ((undefined8 *)local_b0._0_8_ != local_a0) {
              operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
            }
            iVar7 = 0;
            if (((ulong)local_4b0 & 0xfffffffd) == 0) {
              iVar7 = 3;
LAB_001ffb1e:
              bVar5 = false;
            }
            else {
              bVar5 = true;
              if (local_4b0._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2f8,0xc63);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                local_520 = (undefined1  [8])&local_510;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_520,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[11],std::__cxx11::string>
                          (&local_4f8,(fmt *)local_520,(string *)"velocities",
                           (char (*) [11])local_4a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar14);
                poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_2f8,local_4f8._M_dataplus._M_p,
                                    CONCAT62(local_4f8._M_string_length._2_6_,
                                             (undefined2)local_4f8._M_string_length));
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                  operator_delete(local_4f8._M_dataplus._M_p,
                                  CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                           local_4f8.field_2._M_allocated_capacity._0_2_) + 1);
                }
                uVar12 = abStack_470._8_8_;
                if (local_520 != (undefined1  [8])&local_510) {
                  operator_delete((void *)local_520,(ulong)(local_510._M_allocated_capacity + 1));
                }
                if ((string *)uVar12 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar9 = (long *)::std::__cxx11::string::_M_append(local_520,*(ulong *)uVar12);
                  plVar1 = plVar9 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar9 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar1) {
                    local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                    local_4f8.field_2._M_allocated_capacity._2_6_ =
                         (undefined6)((ulong)*plVar1 >> 0x10);
                    local_4f8.field_2._8_2_ = (undefined2)plVar9[3];
                    local_4f8.field_2._10_6_ = (undefined6)((ulong)plVar9[3] >> 0x10);
                    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                  }
                  else {
                    local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                    local_4f8.field_2._M_allocated_capacity._2_6_ =
                         (undefined6)((ulong)*plVar1 >> 0x10);
                    local_4f8._M_dataplus._M_p = (pointer)*plVar9;
                  }
                  local_4f8._M_string_length._0_2_ = (undefined2)plVar9[1];
                  local_4f8._M_string_length._2_6_ = (undefined6)((ulong)plVar9[1] >> 0x10);
                  *plVar9 = (long)plVar1;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)uVar12,(string *)&local_4f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                    operator_delete(local_4f8._M_dataplus._M_p,
                                    CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                             local_4f8.field_2._M_allocated_capacity._0_2_) + 1);
                  }
                  if (local_520 != (undefined1  [8])&local_510) {
                    operator_delete((void *)local_520,(ulong)(local_510._M_allocated_capacity + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                ::std::ios_base::~ios_base(local_288);
                iVar7 = 1;
                goto LAB_001ffb1e;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._0_8_ != &aStack_498) {
              operator_delete((void *)local_4a8._0_8_,aStack_498._M_allocated_capacity + 1);
            }
            if (bVar5) {
              local_e0._16_8_ = local_c0;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_e0 + 0x10),*(long *)(p_Var11 + 1),
                         (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
              local_2f8 = (undefined1  [8])(local_2f0 + 8);
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"normals","");
              pPVar14 = (Property *)local_2f8;
              (anonymous_namespace)::
              ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                        ((ParseResult *)local_4b0,(_anonymous_namespace_ *)local_3d0,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_e0 + 0x10),(string *)local_460.dynamic,(Property *)local_2f8,
                         local_320,
                         (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffadc,uVar6));
              if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
                operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
              }
              if ((undefined8 *)local_e0._16_8_ != local_c0) {
                operator_delete((void *)local_e0._16_8_,local_c0[0] + 1);
              }
              iVar7 = 0;
              if (((ulong)local_4b0 & 0xfffffffd) == 0) {
                iVar7 = 3;
LAB_001ffe2a:
                bVar5 = false;
              }
              else {
                bVar5 = true;
                if (local_4b0._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3)
                  ;
                  poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2f8,0xc65);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  local_520 = (undefined1  [8])&local_510;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_520,"Parsing attribute `{}` failed. Error: {}","");
                  fmt::format<char[8],std::__cxx11::string>
                            (&local_4f8,(fmt *)local_520,(string *)"normals",(char (*) [8])local_4a8
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              pPVar14);
                  poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_2f8,local_4f8._M_dataplus._M_p,
                                      CONCAT62(local_4f8._M_string_length._2_6_,
                                               (undefined2)local_4f8._M_string_length));
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                    operator_delete(local_4f8._M_dataplus._M_p,
                                    CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                             local_4f8.field_2._M_allocated_capacity._0_2_) + 1);
                  }
                  uVar12 = abStack_470._8_8_;
                  if (local_520 != (undefined1  [8])&local_510) {
                    operator_delete((void *)local_520,(ulong)(local_510._M_allocated_capacity + 1));
                  }
                  if ((string *)uVar12 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar9 = (long *)::std::__cxx11::string::_M_append(local_520,*(ulong *)uVar12);
                    plVar1 = plVar9 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar1) {
                      local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                      local_4f8.field_2._M_allocated_capacity._2_6_ =
                           (undefined6)((ulong)*plVar1 >> 0x10);
                      local_4f8.field_2._8_2_ = (undefined2)plVar9[3];
                      local_4f8.field_2._10_6_ = (undefined6)((ulong)plVar9[3] >> 0x10);
                      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                    }
                    else {
                      local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                      local_4f8.field_2._M_allocated_capacity._2_6_ =
                           (undefined6)((ulong)*plVar1 >> 0x10);
                      local_4f8._M_dataplus._M_p = (pointer)*plVar9;
                    }
                    local_4f8._M_string_length._0_2_ = (undefined2)plVar9[1];
                    local_4f8._M_string_length._2_6_ = (undefined6)((ulong)plVar9[1] >> 0x10);
                    *plVar9 = (long)plVar1;
                    plVar9[1] = 0;
                    *(undefined1 *)(plVar9 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)uVar12,(string *)&local_4f8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                      operator_delete(local_4f8._M_dataplus._M_p,
                                      CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                               local_4f8.field_2._M_allocated_capacity._0_2_) + 1);
                    }
                    if (local_520 != (undefined1  [8])&local_510) {
                      operator_delete((void *)local_520,(ulong)(local_510._M_allocated_capacity + 1)
                                     );
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                  ::std::ios_base::~ios_base(local_288);
                  iVar7 = 1;
                  goto LAB_001ffe2a;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._0_8_ != &aStack_498) {
                operator_delete((void *)local_4a8._0_8_,aStack_498._M_allocated_capacity + 1);
              }
              if (bVar5) {
                local_100._16_8_ = local_e0;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)(local_100 + 0x10),*(long *)(p_Var11 + 1),
                           (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
                local_2f8 = (undefined1  [8])(local_2f0 + 8);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2f8,"accelerations","");
                pPVar14 = (Property *)local_2f8;
                (anonymous_namespace)::
                ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                          ((ParseResult *)local_4b0,(_anonymous_namespace_ *)local_3d0,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(local_100 + 0x10),(string *)local_460.dynamic,(Property *)local_2f8,
                           (string *)local_340._24_8_,
                           (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffadc,uVar6));
                if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
                  operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
                }
                if ((undefined1 *)local_100._16_8_ != local_e0) {
                  operator_delete((void *)local_100._16_8_,local_e0._0_8_ + 1);
                }
                iVar7 = 0;
                if (((ulong)local_4b0 & 0xfffffffd) == 0) {
                  iVar7 = 3;
LAB_00200136:
                  bVar5 = false;
                }
                else {
                  bVar5 = true;
                  if (local_4b0._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"():",3);
                    poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2f8,0xc67);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                    local_520 = (undefined1  [8])&local_510;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_520,"Parsing attribute `{}` failed. Error: {}","");
                    fmt::format<char[14],std::__cxx11::string>
                              (&local_4f8,(fmt *)local_520,(string *)"accelerations",
                               (char (*) [14])local_4a8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar14);
                    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_2f8,local_4f8._M_dataplus._M_p,
                                        CONCAT62(local_4f8._M_string_length._2_6_,
                                                 (undefined2)local_4f8._M_string_length));
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                      operator_delete(local_4f8._M_dataplus._M_p,
                                      CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                               local_4f8.field_2._M_allocated_capacity._0_2_) + 1);
                    }
                    uVar12 = abStack_470._8_8_;
                    if (local_520 != (undefined1  [8])&local_510) {
                      operator_delete((void *)local_520,(ulong)(local_510._M_allocated_capacity + 1)
                                     );
                    }
                    if ((string *)uVar12 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar9 = (long *)::std::__cxx11::string::_M_append(local_520,*(ulong *)uVar12)
                      ;
                      plVar1 = plVar9 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)plVar1) {
                        local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                        local_4f8.field_2._M_allocated_capacity._2_6_ =
                             (undefined6)((ulong)*plVar1 >> 0x10);
                        local_4f8.field_2._8_2_ = (undefined2)plVar9[3];
                        local_4f8.field_2._10_6_ = (undefined6)((ulong)plVar9[3] >> 0x10);
                        local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                      }
                      else {
                        local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                        local_4f8.field_2._M_allocated_capacity._2_6_ =
                             (undefined6)((ulong)*plVar1 >> 0x10);
                        local_4f8._M_dataplus._M_p = (pointer)*plVar9;
                      }
                      local_4f8._M_string_length._0_2_ = (undefined2)plVar9[1];
                      local_4f8._M_string_length._2_6_ = (undefined6)((ulong)plVar9[1] >> 0x10);
                      *plVar9 = (long)plVar1;
                      plVar9[1] = 0;
                      *(undefined1 *)(plVar9 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)uVar12,(string *)&local_4f8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                        operator_delete(local_4f8._M_dataplus._M_p,
                                        CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                                 local_4f8.field_2._M_allocated_capacity._0_2_) + 1)
                        ;
                      }
                      if (local_520 != (undefined1  [8])&local_510) {
                        operator_delete((void *)local_520,
                                        (ulong)(local_510._M_allocated_capacity + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                    ::std::ios_base::~ios_base(local_288);
                    iVar7 = 1;
                    goto LAB_00200136;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4a8._0_8_ != &aStack_498) {
                  operator_delete((void *)local_4a8._0_8_,aStack_498._M_allocated_capacity + 1);
                }
                if (bVar5) {
                  local_110[0] = (pointer)local_100;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_110,*(long *)(p_Var11 + 1),
                             (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
                  local_2f8 = (undefined1  [8])(local_2f0 + 8);
                  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"widths","")
                  ;
                  pPVar14 = (Property *)local_2f8;
                  (anonymous_namespace)::
                  ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                            ((ParseResult *)local_4b0,(_anonymous_namespace_ *)local_3d0,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_110,(string *)local_460.dynamic,(Property *)local_2f8,
                             (string *)local_340._16_8_,
                             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffadc,uVar6));
                  if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
                    operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
                  }
                  if (local_110[0] != (pointer)local_100) {
                    operator_delete(local_110[0],local_100._0_8_ + 1);
                  }
                  iVar7 = 0;
                  if (((ulong)local_4b0 & 0xfffffffd) == 0) {
                    iVar7 = 3;
LAB_00200442:
                    bVar5 = false;
                  }
                  else {
                    bVar5 = true;
                    if (local_4b0._0_4_ != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2f8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2f8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2f8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2f8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2f8,"():",3);
                      poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2f8,0xc68);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      local_520 = (undefined1  [8])&local_510;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_520,"Parsing attribute `{}` failed. Error: {}","");
                      fmt::format<char[7],std::__cxx11::string>
                                (&local_4f8,(fmt *)local_520,(string *)"widths",
                                 (char (*) [7])local_4a8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar14);
                      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_2f8,local_4f8._M_dataplus._M_p,
                                          CONCAT62(local_4f8._M_string_length._2_6_,
                                                   (undefined2)local_4f8._M_string_length));
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                        operator_delete(local_4f8._M_dataplus._M_p,
                                        CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                                 local_4f8.field_2._M_allocated_capacity._0_2_) + 1)
                        ;
                      }
                      uVar12 = abStack_470._8_8_;
                      if (local_520 != (undefined1  [8])&local_510) {
                        operator_delete((void *)local_520,
                                        (ulong)(local_510._M_allocated_capacity + 1));
                      }
                      if ((string *)uVar12 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        plVar9 = (long *)::std::__cxx11::string::_M_append
                                                   (local_520,*(ulong *)uVar12);
                        plVar1 = plVar9 + 2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar9 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)plVar1) {
                          local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                          local_4f8.field_2._M_allocated_capacity._2_6_ =
                               (undefined6)((ulong)*plVar1 >> 0x10);
                          local_4f8.field_2._8_2_ = (undefined2)plVar9[3];
                          local_4f8.field_2._10_6_ = (undefined6)((ulong)plVar9[3] >> 0x10);
                          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                        }
                        else {
                          local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                          local_4f8.field_2._M_allocated_capacity._2_6_ =
                               (undefined6)((ulong)*plVar1 >> 0x10);
                          local_4f8._M_dataplus._M_p = (pointer)*plVar9;
                        }
                        local_4f8._M_string_length._0_2_ = (undefined2)plVar9[1];
                        local_4f8._M_string_length._2_6_ = (undefined6)((ulong)plVar9[1] >> 0x10);
                        *plVar9 = (long)plVar1;
                        plVar9[1] = 0;
                        *(undefined1 *)(plVar9 + 2) = 0;
                        ::std::__cxx11::string::operator=((string *)uVar12,(string *)&local_4f8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                          operator_delete(local_4f8._M_dataplus._M_p,
                                          CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                                   local_4f8.field_2._M_allocated_capacity._0_2_) +
                                          1);
                        }
                        if (local_520 != (undefined1  [8])&local_510) {
                          operator_delete((void *)local_520,
                                          (ulong)(local_510._M_allocated_capacity + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                      ::std::ios_base::~ios_base(local_288);
                      iVar7 = 1;
                      goto LAB_00200442;
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4a8._0_8_ != &aStack_498) {
                    operator_delete((void *)local_4a8._0_8_,aStack_498._M_allocated_capacity + 1);
                  }
                  if (bVar5) {
                    local_140._16_8_ = local_120;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)(local_140 + 0x10),*(long *)(p_Var11 + 1),
                               (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
                    local_2f8 = (undefined1  [8])(local_2f0 + 8);
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2f8,"order","");
                    pPVar14 = (Property *)local_2f8;
                    (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                              ((ParseResult *)local_4b0,(_anonymous_namespace_ *)local_3d0,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(local_140 + 0x10),(string *)local_460.dynamic,
                               (Property *)local_2f8,(string *)local_340._8_8_,
                               (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffffadc,uVar6));
                    if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
                      operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
                    }
                    if ((undefined8 *)local_140._16_8_ != local_120) {
                      operator_delete((void *)local_140._16_8_,local_120[0] + 1);
                    }
                    iVar7 = 0;
                    if (((ulong)local_4b0 & 0xfffffffd) == 0) {
                      iVar7 = 3;
LAB_0020074e:
                      bVar5 = false;
                    }
                    else {
                      bVar5 = true;
                      if (local_4b0._0_4_ != Unmatched) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2f8,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2f8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2f8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2f8,"ReconstructPrim",0xf);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2f8,"():",3);
                        poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_2f8,0xc6b);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                        local_520 = (undefined1  [8])&local_510;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_520,"Parsing attribute `{}` failed. Error: {}",""
                                  );
                        fmt::format<char[6],std::__cxx11::string>
                                  (&local_4f8,(fmt *)local_520,(string *)"order",
                                   (char (*) [6])local_4a8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pPVar14);
                        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)local_2f8,local_4f8._M_dataplus._M_p,
                                            CONCAT62(local_4f8._M_string_length._2_6_,
                                                     (undefined2)local_4f8._M_string_length));
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                          operator_delete(local_4f8._M_dataplus._M_p,
                                          CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                                   local_4f8.field_2._M_allocated_capacity._0_2_) +
                                          1);
                        }
                        uVar12 = abStack_470._8_8_;
                        if (local_520 != (undefined1  [8])&local_510) {
                          operator_delete((void *)local_520,
                                          (ulong)(local_510._M_allocated_capacity + 1));
                        }
                        if ((string *)uVar12 != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          plVar9 = (long *)::std::__cxx11::string::_M_append
                                                     (local_520,*(ulong *)uVar12);
                          plVar1 = plVar9 + 2;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)*plVar9 ==
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)plVar1) {
                            local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                            local_4f8.field_2._M_allocated_capacity._2_6_ =
                                 (undefined6)((ulong)*plVar1 >> 0x10);
                            local_4f8.field_2._8_2_ = (undefined2)plVar9[3];
                            local_4f8.field_2._10_6_ = (undefined6)((ulong)plVar9[3] >> 0x10);
                            local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                          }
                          else {
                            local_4f8.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                            local_4f8.field_2._M_allocated_capacity._2_6_ =
                                 (undefined6)((ulong)*plVar1 >> 0x10);
                            local_4f8._M_dataplus._M_p = (pointer)*plVar9;
                          }
                          local_4f8._M_string_length._0_2_ = (undefined2)plVar9[1];
                          local_4f8._M_string_length._2_6_ = (undefined6)((ulong)plVar9[1] >> 0x10);
                          *plVar9 = (long)plVar1;
                          plVar9[1] = 0;
                          *(undefined1 *)(plVar9 + 2) = 0;
                          ::std::__cxx11::string::operator=((string *)uVar12,(string *)&local_4f8);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                            operator_delete(local_4f8._M_dataplus._M_p,
                                            CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                                     local_4f8.field_2._M_allocated_capacity._0_2_)
                                            + 1);
                          }
                          if (local_520 != (undefined1  [8])&local_510) {
                            operator_delete((void *)local_520,
                                            (ulong)(local_510._M_allocated_capacity + 1));
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                        ::std::ios_base::~ios_base(local_288);
                        iVar7 = 1;
                        goto LAB_0020074e;
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4a8._0_8_ != &aStack_498) {
                      operator_delete((void *)local_4a8._0_8_,aStack_498._M_allocated_capacity + 1);
                    }
                    if (bVar5) {
                      local_150._0_8_ = local_140;
                      ::std::__cxx11::string::_M_construct<char*>
                                (local_150,*(long *)(p_Var11 + 1),
                                 (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
                      local_2f8 = (undefined1  [8])(local_2f0 + 8);
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2f8,"knots","");
                      uVar12 = local_460.dynamic;
                      pPVar14 = (Property *)local_2f8;
                      (anonymous_namespace)::
                      ParseTypedAttribute<std::vector<double,std::allocator<double>>>
                                ((ParseResult *)local_4b0,(_anonymous_namespace_ *)local_3d0,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_150,(string *)local_460.dynamic,(Property *)local_2f8,
                                 (string *)local_340.data._0_8_,
                                 (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffadc,uVar6));
                      if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
                        operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_150._0_8_ != local_140) {
                        operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
                      }
                      iVar7 = 0;
                      if (((ulong)local_4b0 & 0xfffffffd) == 0) {
                        iVar7 = 3;
LAB_00200a19:
                        bVar5 = false;
                      }
                      else {
                        bVar5 = true;
                        if (local_4b0._0_4_ != Unmatched) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,"ReconstructPrim",0xf);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,"():",3);
                          poVar8 = (ostream *)
                                   ::std::ostream::operator<<((Property *)local_2f8,0xc6c);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                          local_520 = (undefined1  [8])&local_510;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_520,"Parsing attribute `{}` failed. Error: {}",
                                     "");
                          uVar12 = local_4a8;
                          fmt::format<char[6],std::__cxx11::string>
                                    (&local_4f8,(fmt *)local_520,(string *)"knots",
                                     (char (*) [6])uVar12,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pPVar14);
                          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_2f8,local_4f8._M_dataplus._M_p,
                                              CONCAT62(local_4f8._M_string_length._2_6_,
                                                       (undefined2)local_4f8._M_string_length));
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                            operator_delete(local_4f8._M_dataplus._M_p,
                                            CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                                     local_4f8.field_2._M_allocated_capacity._0_2_)
                                            + 1);
                          }
                          uVar3 = abStack_470._8_8_;
                          if (local_520 != (undefined1  [8])&local_510) {
                            operator_delete((void *)local_520,
                                            (ulong)(local_510._M_allocated_capacity + 1));
                          }
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              uVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+(&local_4f8,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_520,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)uVar3);
                            ::std::__cxx11::string::operator=((string *)uVar3,(string *)&local_4f8);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                              operator_delete(local_4f8._M_dataplus._M_p,
                                              CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_
                                                       ,local_4f8.field_2._M_allocated_capacity.
                                                        _0_2_) + 1);
                            }
                            if (local_520 != (undefined1  [8])&local_510) {
                              operator_delete((void *)local_520,
                                              (ulong)(local_510._M_allocated_capacity + 1));
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                          ::std::ios_base::~ios_base(local_288);
                          iVar7 = 1;
                          goto LAB_00200a19;
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4a8._0_8_ != &aStack_498) {
                        operator_delete((void *)local_4a8._0_8_,aStack_498._M_allocated_capacity + 1
                                       );
                      }
                      if (bVar5) {
                        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
                        ::std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_380,*(long *)(p_Var11 + 1),
                                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1))
                        ;
                        local_418._0_8_ = local_418 + 0x10;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_418,"ranges","");
                        sVar4 = local_380._M_string_length;
                        uVar3 = local_418._8_8_;
                        local_518 = local_510._M_local_buf + 8;
                        local_510._M_allocated_capacity = 0;
                        local_510._M_local_buf[8] = '\0';
                        __n = (storage_t<double>)local_380._M_string_length;
                        if ((ulong)local_418._8_8_ < local_380._M_string_length) {
                          __n = (storage_t<double>)local_418._8_8_;
                        }
                        if (__n == (storage_t<double>)0x0) {
                          bVar5 = true;
                        }
                        else {
                          iVar7 = bcmp(local_380._M_dataplus._M_p,(void *)local_418._0_8_,
                                       (size_t)__n);
                          bVar5 = iVar7 == 0;
                        }
                        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT71((int7)((ulong)uVar12 >> 8),sVar4 != uVar3);
                        if ((bool)(bVar5 ^ 1U | sVar4 != uVar3)) {
                          local_520._0_4_ = 1;
                        }
                        else {
                          if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000)
                          {
                            local_520._0_4_ = 7;
                            local_4b0 = (undefined1  [8])(local_4a8 + 8);
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_4b0,
                                       "Property `{}` must be Attribute, but declared as Relationship."
                                       ,"");
                            fmt::format<std::__cxx11::string>
                                      ((string *)local_2f8,(fmt *)local_4b0,(string *)local_418,args
                                      );
                            ::std::__cxx11::string::operator=
                                      ((string *)&local_518,(string *)local_2f8);
                            if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
                              operator_delete((void *)local_2f8,
                                              local_2e8[0]._M_allocated_capacity + 1);
                            }
                            if (local_4b0 != (undefined1  [8])(local_4a8 + 8)) {
                              operator_delete((void *)local_4b0,local_4a8._8_8_ + 1);
                            }
                          }
                          if (p_Var11[6]._M_left != p_Var11[6]._M_parent) {
                            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                       local_350,
                                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                       &p_Var11[6]._M_parent);
                            local_520 = (undefined1  [8])((ulong)local_520 & 0xffffffff00000000);
                          }
                          Attribute::type_name_abi_cxx11_
                                    ((string *)&local_3f8,(Attribute *)local_460.dynamic);
                          tinyusdz::value::
                          TypeTraits<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                          ::type_name_abi_cxx11_();
                          if (local_2f0 == (undefined1  [8])local_3f8._8_8_) {
                            if ((anon_struct_8_0_00000001_for___align)local_2f0 ==
                                (anon_struct_8_0_00000001_for___align)0x0) {
                              bVar5 = true;
                            }
                            else {
                              iVar7 = bcmp((void *)local_2f8,(void *)local_3f8._M_allocated_capacity
                                           ,(size_t)local_2f0);
                              bVar5 = iVar7 == 0;
                            }
                          }
                          else {
                            bVar5 = false;
                          }
                          bVar18 = true;
                          if (!bVar5) {
                            tinyusdz::value::
                            TypeTraits<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                            ::underlying_type_name_abi_cxx11_();
                            if (local_60._24_8_ == local_3f8._8_8_) {
                              if ((undefined1 *)local_60._24_8_ != (undefined1 *)0x0) {
                                iVar7 = bcmp((void *)local_60._16_8_,
                                             (void *)local_3f8._M_allocated_capacity,local_60._24_8_
                                            );
                                bVar18 = iVar7 == 0;
                              }
                            }
                            else {
                              bVar18 = false;
                            }
                          }
                          if ((!bVar5) && ((_Alloc_hider *)local_60._16_8_ != local_40)) {
                            operator_delete((void *)local_60._16_8_,(ulong)(local_40[0]._M_p + 1));
                          }
                          if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
                            operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1
                                           );
                          }
                          if (bVar18) {
                            iVar7 = *(int *)((long)&p_Var11[0x17]._M_parent + 4);
                            if (iVar7 != 1) {
                              if (iVar7 == 0) {
                                (local_448->ranges)._value_empty = true;
                                AttrMetas::operator=(local_450,(AttrMetas *)(p_Var11 + 7));
                                __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_418;
LAB_002013eb:
                                ::std::
                                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                ::_M_insert_unique<std::__cxx11::string_const&>
                                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                            *)local_3d0,__v);
                                local_520 = (undefined1  [8])((ulong)local_520 & 0xffffffff00000000)
                                ;
                              }
                              else {
                                pPVar14 = (Property *)0x25;
                                ::std::__cxx11::string::_M_replace
                                          ((ulong)&local_518,0,
                                           (char *)local_510._M_allocated_capacity,0x3bccd4);
                                local_520._0_4_ = 8;
                              }
                              goto LAB_002013f8;
                            }
                            if (p_Var11[5]._M_left == p_Var11[5]._M_parent) {
                              if (p_Var11[4]._M_right == (_Base_ptr)0x0) {
                                bVar5 = false;
                              }
                              else {
                                iVar7 = (**(code **)p_Var11[4]._M_right)();
                                bVar5 = iVar7 == 4;
                              }
                              if ((bVar5) || ((p_Var11[5]._M_color & _S_black) != _S_red)) {
                                (local_448->ranges)._blocked = true;
                              }
                            }
                            if (((char)p_Var11[5]._M_color == _S_red) &&
                               ((((p_Var11[4]._M_right != (_Base_ptr)0x0 &&
                                  (iVar7 = (**(code **)p_Var11[4]._M_right)(), iVar7 == 0)) ||
                                 ((p_Var11[4]._M_right != (_Base_ptr)0x0 &&
                                  (iVar7 = (**(code **)p_Var11[4]._M_right)(), iVar7 == 1)))) &&
                                (p_Var11[5]._M_left == p_Var11[5]._M_parent)))) {
                              bVar5 = true;
                              bVar18 = false;
                            }
                            else {
                              local_4d8._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                              local_4d8._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                              local_4d8._dirty = false;
                              local_4d8._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                              local_4d8._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                              local_4d8._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                              local_4f8.field_2._M_allocated_capacity._0_2_ = 0;
                              local_4f8.field_2._M_allocated_capacity._2_6_ = 0;
                              local_4f8.field_2._8_2_ = 0;
                              local_4f8._M_dataplus._M_p = (pointer)0x0;
                              local_4f8._M_string_length._0_2_ = 0;
                              local_4f8._M_string_length._2_6_ = 0;
                              bVar5 = primvar::PrimVar::is_valid((PrimVar *)&p_Var11[4]._M_parent);
                              if (bVar5) {
                                if (((char)p_Var11[5]._M_color == _S_red) &&
                                   (((p_Var11[4]._M_right != (_Base_ptr)0x0 &&
                                     (iVar7 = (**(code **)p_Var11[4]._M_right)(), iVar7 == 0)) ||
                                    ((p_Var11[4]._M_right != (_Base_ptr)0x0 &&
                                     (iVar7 = (**(code **)p_Var11[4]._M_right)(), iVar7 == 1)))))) {
                                  cVar15 = '\0';
                                }
                                else {
                                  primvar::PrimVar::
                                  get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                                            (&local_3a0,(PrimVar *)&p_Var11[4]._M_parent);
                                  cVar15 = local_3a0.has_value_;
                                  local_438 = local_3a0.has_value_;
                                  if (local_3a0.has_value_ == true) {
                                    local_430.
                                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start =
                                         (pointer)local_3a0.contained.data._0_8_;
                                    local_430.
                                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish =
                                         (pointer)local_3a0.contained._8_8_;
                                    local_430.
                                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                         (pointer)local_3a0.contained._16_8_;
                                    local_3a0.contained.data.__align =
                                         (anon_struct_8_0_00000001_for___align)0x0;
                                    local_3a0.contained._8_8_ = 0;
                                    local_3a0.contained._16_8_ = (pointer)0x0;
                                    ::std::
                                    vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                    ::operator=((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                 *)&local_4f8,&local_430);
                                    local_4f8.field_2._8_2_ = 1;
                                  }
                                  if ((local_438 == '\x01') &&
                                     ((anon_struct_8_0_00000001_for___align)
                                      local_430.
                                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start !=
                                      (anon_struct_8_0_00000001_for___align)0x0)) {
                                    operator_delete(local_430.
                                                                                                        
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_430.
                                                                                                                
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_430.
                                                                                                                    
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                }
                                if (p_Var11[5]._M_left == p_Var11[5]._M_parent) {
                                  if (cVar15 == '\0') goto LAB_00200fac;
                                }
                                else {
                                  local_460._12_4_ =
                                       (undefined4)
                                       CONCAT71((int7)((ulong)p_Var11[5]._M_left >> 8),local_4b0[0])
                                  ;
                                  lVar16 = 0;
                                  uVar17 = 0;
                                  do {
                                    if ((char)p_Var11[6]._M_color == _S_black) {
                                      tinyusdz::value::TimeSamples::update
                                                ((TimeSamples *)&p_Var11[5]._M_parent);
                                    }
                                    p_Var2 = p_Var11[5]._M_parent;
                                    if (*(char *)((long)&p_Var2[1]._M_color + lVar16) == '\x01') {
                                      TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                      ::add_blocked_sample
                                                (&local_4d8,
                                                 *(double *)((long)&p_Var2->_M_color + lVar16));
                                    }
                                    else {
                                      tinyusdz::value::Value::
                                      get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                                                (&local_3a0,
                                                 (Value *)((long)&p_Var2->_M_parent + lVar16),false)
                                      ;
                                      bVar5 = local_3a0.has_value_;
                                      local_438 = local_3a0.has_value_;
                                      if (local_3a0.has_value_ == true) {
                                        local_430.
                                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start =
                                             (pointer)local_3a0.contained.data._0_8_;
                                        local_430.
                                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish =
                                             (pointer)local_3a0.contained._8_8_;
                                        local_430.
                                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                             (pointer)local_3a0.contained._16_8_;
                                        local_3a0.contained.data.__align =
                                             (anon_struct_8_0_00000001_for___align)0x0;
                                        local_3a0.contained._8_8_ = 0;
                                        local_3a0.contained._16_8_ = (pointer)0x0;
                                        TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                        ::add_sample(&local_4d8,
                                                     *(double *)((long)&p_Var2->_M_color + lVar16),
                                                     &local_430);
                                      }
                                      else {
                                        sStack_478 = 0;
                                        abStack_470[0] = false;
                                        abStack_470[1] = false;
                                        abStack_470[2] = false;
                                        abStack_470[3] = false;
                                        abStack_470[4] = false;
                                        abStack_470[5] = false;
                                        abStack_470[6] = false;
                                        abStack_470[7] = false;
                                        local_488 = (pointer)0x0;
                                        _Stack_480._M_p = (pointer)0x0;
                                        aStack_498._M_allocated_capacity = 0;
                                        aStack_498._8_8_ = 0;
                                        local_4a8._0_8_ =
                                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)0x0;
                                        local_4a8._8_8_ = 0;
                                        local_460._12_4_ = 0;
                                      }
                                      if ((local_438 == '\x01') &&
                                         ((anon_struct_8_0_00000001_for___align)
                                          local_430.
                                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start !=
                                          (anon_struct_8_0_00000001_for___align)0x0)) {
                                        operator_delete(local_430.
                                                                                                                
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_430.
                                                                                                                
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_430.
                                                                                                                    
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      if (bVar5 == false) {
                                        local_4b0[0] = (fmt)(char)local_460._12_4_;
                                        goto LAB_0020124e;
                                      }
                                    }
                                    uVar17 = uVar17 + 1;
                                    lVar16 = lVar16 + 0x28;
                                  } while (uVar17 < (ulong)(((long)p_Var11[5]._M_left -
                                                             (long)p_Var11[5]._M_parent >> 3) *
                                                           -0x3333333333333333));
                                  local_4b0 = (undefined1  [8])
                                              ((ulong)local_4b0 & 0xffffffffffffff00);
                                }
                                local_4b0[0] = (fmt)0x1;
                                local_4a8._0_8_ = local_4f8._M_dataplus._M_p;
                                local_4a8._8_8_ =
                                     CONCAT62(local_4f8._M_string_length._2_6_,
                                              (undefined2)local_4f8._M_string_length);
                                aStack_498._M_allocated_capacity =
                                     CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_,
                                              local_4f8.field_2._M_allocated_capacity._0_2_);
                                local_4f8._M_dataplus._M_p = (pointer)0x0;
                                local_4f8._M_string_length._0_2_ = 0;
                                local_4f8._M_string_length._2_6_ = 0;
                                local_4f8.field_2._M_allocated_capacity._0_2_ = 0;
                                local_4f8.field_2._M_allocated_capacity._2_6_ = 0;
                                aStack_498._8_2_ = local_4f8.field_2._8_2_;
                                local_488 = local_4d8._samples.
                                            super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                _Stack_480._M_p =
                                     (pointer)CONCAT71(local_4d8._samples.
                                                                                                              
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                                  local_4d8._samples.
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._0_1_);
                                sStack_478 = CONCAT71(local_4d8._samples.
                                                                                                            
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_7_,local_4d8._samples.
                                                                                                                  
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_);
                                local_4d8._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                                local_4d8._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                                local_4d8._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_4d8._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                                local_4d8._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                                abStack_470[0] = local_4d8._dirty;
                              }
                              else {
LAB_00200fac:
                                local_4b0 = (undefined1  [8])((ulong)local_4b0 & 0xffffffffffffff00)
                                ;
                                sStack_478 = 0;
                                abStack_470[0] = false;
                                abStack_470[1] = false;
                                abStack_470[2] = false;
                                abStack_470[3] = false;
                                abStack_470[4] = false;
                                abStack_470[5] = false;
                                abStack_470[6] = false;
                                abStack_470[7] = false;
                                local_488 = (pointer)0x0;
                                _Stack_480._M_p = (pointer)0x0;
                                aStack_498._M_allocated_capacity = 0;
                                aStack_498._8_8_ = 0;
                                local_4a8._0_8_ =
                                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)0x0;
                                local_4a8._8_8_ = 0;
                              }
LAB_0020124e:
                              ::std::
                              vector<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                              ::~vector(&local_4d8._samples);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_4f8._M_dataplus._M_p !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0) {
                                operator_delete(local_4f8._M_dataplus._M_p,
                                                CONCAT62(local_4f8.field_2._M_allocated_capacity.
                                                         _2_6_,local_4f8.field_2.
                                                               _M_allocated_capacity._0_2_) -
                                                (long)local_4f8._M_dataplus._M_p);
                              }
                              local_2f8[0] = local_4b0[0];
                              if (local_4b0[0] == (fmt)0x1) {
                                local_2f0 = (undefined1  [8])local_4a8._0_8_;
                                local_2e8[0]._M_allocated_capacity = local_4a8._8_8_;
                                local_2e8[0]._8_8_ = aStack_498._M_allocated_capacity;
                                aStack_498._M_allocated_capacity = 0;
                                local_4a8._0_8_ =
                                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)0x0;
                                local_4a8._8_8_ = 0;
                                local_2e8[1]._0_2_ = aStack_498._8_2_;
                                local_2e8[1]._8_8_ = local_488;
                                local_2c8 = _Stack_480._M_p;
                                auStack_2c0._0_8_ = sStack_478;
                                sStack_478 = 0;
                                local_488 = (pointer)0x0;
                                _Stack_480._M_p = (pointer)0x0;
                                auStack_2c0[8] = abStack_470[0];
                                nonstd::optional_lite::detail::
                                storage_t<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                                ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                                                  *)local_4a8);
                              }
                              bVar5 = (bool)local_2f8[0];
                              if ((bool)local_2f8[0] == true) {
                                nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
                                ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
                                             *)local_360,
                                            (Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                             *)local_2f0);
                              }
                              else {
                                local_520._0_4_ = 8;
                                pPVar14 = (Property *)0x55;
                                ::std::__cxx11::string::_M_replace
                                          ((ulong)&local_518,0,
                                           (char *)local_510._M_allocated_capacity,0x3bcfa2);
                              }
                              if ((bool)local_2f8[0] == true) {
                                nonstd::optional_lite::detail::
                                storage_t<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                                ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                                                  *)local_2f0);
                              }
                              if (bVar5 != false) {
                                AttrMetas::operator=(local_450,(AttrMetas *)(p_Var11 + 7));
                                ::std::
                                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                ::_M_insert_unique<std::__cxx11::string_const&>
                                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                            *)local_3d0,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_418);
                                local_520 = (undefined1  [8])((ulong)local_520 & 0xffffffff00000000)
                                ;
                              }
                              bVar18 = true;
                              bVar5 = false;
                            }
                            if (bVar5) {
                              if (p_Var11[6]._M_left != p_Var11[6]._M_parent) {
                                AttrMetas::operator=(local_450,(AttrMetas *)(p_Var11 + 7));
                                __v = &local_380;
                                goto LAB_002013eb;
                              }
                              goto LAB_002013f8;
                            }
                            if ((undefined1 *)local_3f8._M_allocated_capacity != local_3e8) {
                              operator_delete((void *)local_3f8._M_allocated_capacity,
                                              local_3e8._0_8_ + 1);
                            }
                            if ((bVar18) || (local_518 == local_510._M_local_buf + 8))
                            goto LAB_0020141d;
                            aVar13._1_7_ = local_510._9_7_;
                            aVar13._0_1_ = local_510._M_local_buf[8];
                            uVar12 = local_518;
                          }
                          else {
                            local_520._0_4_ = 3;
                            ::std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)(local_2f0 + 8),"Property type mismatch. ",0x18);
                            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               ((ostream *)(local_2f0 + 8),(char *)local_418._0_8_,
                                                local_418._8_8_);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8," expects type `",0xf);
                            tinyusdz::value::
                            TypeTraits<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                            ::type_name_abi_cxx11_();
                            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar8,(char *)local_4b0,local_4a8._0_8_);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"` but defined as type `",0x17);
                            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar8,(char *)local_3f8._M_allocated_capacity,
                                                local_3f8._8_8_);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"`",1);
                            if (local_4b0 != (undefined1  [8])(local_4a8 + 8)) {
                              operator_delete((void *)local_4b0,local_4a8._8_8_ + 1);
                            }
                            ::std::__cxx11::stringbuf::str();
                            ::std::__cxx11::string::operator=
                                      ((string *)&local_518,(string *)local_4b0);
                            if (local_4b0 != (undefined1  [8])(local_4a8 + 8)) {
                              operator_delete((void *)local_4b0,local_4a8._8_8_ + 1);
                            }
                            ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2f8);
                            ::std::ios_base::~ios_base(local_278);
LAB_002013f8:
                            aVar13 = (anon_struct_8_0_00000001_for___align)local_3e8._0_8_;
                            uVar12 = local_3f8._M_allocated_capacity;
                            if ((undefined1 *)local_3f8._M_allocated_capacity == local_3e8)
                            goto LAB_0020141d;
                          }
                          operator_delete((void *)uVar12,(long)aVar13 + 1);
                        }
LAB_0020141d:
                        if ((pointer)local_418._0_8_ != (pointer)(local_418 + 0x10)) {
                          operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_380._M_dataplus._M_p != &local_380.field_2) {
                          operator_delete(local_380._M_dataplus._M_p,
                                          local_380.field_2._M_allocated_capacity + 1);
                        }
                        iVar7 = 0;
                        if (((ulong)local_520 & 0xfffffffd) == 0) {
                          iVar7 = 3;
LAB_0020165e:
                          bVar5 = false;
                        }
                        else {
                          bVar5 = true;
                          if (local_520._0_4_ != 1) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       ,0x5a);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,"ReconstructPrim",0xf);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,"():",3);
                            poVar8 = (ostream *)
                                     ::std::ostream::operator<<((Property *)local_2f8,0xc6d);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                            local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_4f8,
                                       "Parsing attribute `{}` failed. Error: {}","");
                            fmt::format<char[7],std::__cxx11::string>
                                      ((string *)local_4b0,(fmt *)&local_4f8,(string *)"ranges",
                                       (char (*) [7])&local_518,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)pPVar14);
                            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               ((ostream *)local_2f8,(char *)local_4b0,
                                                local_4a8._0_8_);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                            if (local_4b0 != (undefined1  [8])(local_4a8 + 8)) {
                              operator_delete((void *)local_4b0,local_4a8._8_8_ + 1);
                            }
                            uVar12 = abStack_470._8_8_;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                              operator_delete(local_4f8._M_dataplus._M_p,
                                              CONCAT62(local_4f8.field_2._M_allocated_capacity._2_6_
                                                       ,local_4f8.field_2._M_allocated_capacity.
                                                        _0_2_) + 1);
                            }
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )uVar12 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_4b0,&local_4f8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)uVar12);
                              ::std::__cxx11::string::operator=
                                        ((string *)uVar12,(string *)local_4b0);
                              if (local_4b0 != (undefined1  [8])(local_4a8 + 8)) {
                                operator_delete((void *)local_4b0,local_4a8._8_8_ + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                                operator_delete(local_4f8._M_dataplus._M_p,
                                                CONCAT62(local_4f8.field_2._M_allocated_capacity.
                                                         _2_6_,local_4f8.field_2.
                                                               _M_allocated_capacity._0_2_) + 1);
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_2f8);
                            ::std::ios_base::~ios_base(local_288);
                            iVar7 = 1;
                            goto LAB_0020165e;
                          }
                        }
                        if (local_518 != local_510._M_local_buf + 8) {
                          operator_delete(local_518,
                                          CONCAT71(local_510._9_7_,local_510._M_local_buf[8]) + 1);
                        }
                        if (bVar5) {
                          local_170._M_p = (pointer)&local_160;
                          ::std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_170,*(long *)(p_Var11 + 1),
                                     (long)&(p_Var11[1]._M_parent)->_M_color +
                                     *(long *)(p_Var11 + 1));
                          local_2f8 = (undefined1  [8])(local_2f0 + 8);
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_2f8,"pointWeights","");
                          pPVar14 = (Property *)local_2f8;
                          (anonymous_namespace)::
                          ParseTypedAttribute<std::vector<double,std::allocator<double>>>
                                    ((ParseResult *)local_4b0,(_anonymous_namespace_ *)local_3d0,
                                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_170,(string *)local_460.dynamic,(Property *)local_2f8
                                     ,local_348,
                                     (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffadc,uVar6));
                          if (local_2f8 != (undefined1  [8])(local_2f0 + 8)) {
                            operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1
                                           );
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_170._M_p != &local_160) {
                            operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
                          }
                          iVar7 = 0;
                          if (((ulong)local_4b0 & 0xfffffffd) == 0) {
                            iVar7 = 3;
LAB_00201920:
                            bVar5 = false;
                          }
                          else {
                            bVar5 = true;
                            if (local_4b0._0_4_ != Unmatched) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_2f8);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"[error]",7);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         ,0x5a);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"ReconstructPrim",0xf);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"():",3);
                              poVar8 = (ostream *)
                                       ::std::ostream::operator<<((Property *)local_2f8,0xc6e);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                              local_520 = (undefined1  [8])&local_510;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_520,
                                         "Parsing attribute `{}` failed. Error: {}","");
                              fmt::format<char[13],std::__cxx11::string>
                                        (&local_4f8,(fmt *)local_520,(string *)"pointWeights",
                                         (char (*) [13])local_4a8,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)pPVar14);
                              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 ((ostream *)local_2f8,local_4f8._M_dataplus._M_p,
                                                  CONCAT62(local_4f8._M_string_length._2_6_,
                                                           (undefined2)local_4f8._M_string_length));
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                                operator_delete(local_4f8._M_dataplus._M_p,
                                                CONCAT62(local_4f8.field_2._M_allocated_capacity.
                                                         _2_6_,local_4f8.field_2.
                                                               _M_allocated_capacity._0_2_) + 1);
                              }
                              uVar12 = abStack_470._8_8_;
                              if (local_520 != (undefined1  [8])&local_510) {
                                operator_delete((void *)local_520,
                                                (ulong)(local_510._M_allocated_capacity + 1));
                              }
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)uVar12 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                ::std::operator+(&local_4f8,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_520,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)uVar12);
                                ::std::__cxx11::string::operator=
                                          ((string *)uVar12,(string *)&local_4f8);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                                  operator_delete(local_4f8._M_dataplus._M_p,
                                                  CONCAT62(local_4f8.field_2._M_allocated_capacity.
                                                           _2_6_,local_4f8.field_2.
                                                                 _M_allocated_capacity._0_2_) + 1);
                                }
                                if (local_520 != (undefined1  [8])&local_510) {
                                  operator_delete((void *)local_520,
                                                  (ulong)(local_510._M_allocated_capacity + 1));
                                }
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_2f8);
                              ::std::ios_base::~ios_base(local_288);
                              iVar7 = 1;
                              goto LAB_00201920;
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_4a8._0_8_ != &aStack_498) {
                            operator_delete((void *)local_4a8._0_8_,
                                            aStack_498._M_allocated_capacity + 1);
                          }
                          if (bVar5) {
                            __k = p_Var11 + 1;
                            cVar10 = ::std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)local_3d0,(key_type *)__k);
                            if (cVar10._M_node == (_Base_ptr)(local_3d0 + 8)) {
                              this = ::std::
                                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                     ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                                  *)local_358,(key_type *)__k);
                              Property::operator=(this,(Property *)local_460.dynamic);
                              ::std::
                              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              ::_M_insert_unique<std::__cxx11::string_const&>
                                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                          *)local_3d0,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)__k);
                            }
                            cVar10 = ::std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)local_3d0,(key_type *)__k);
                            iVar7 = 0;
                            if (cVar10._M_node == (_Base_ptr)(local_3d0 + 8)) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_2f8);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"[warn]",6);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         ,0x5a);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"ReconstructPrim",0xf);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"():",3);
                              poVar8 = (ostream *)
                                       ::std::ostream::operator<<((Property *)local_2f8,0xc72);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_4b0,"Unsupported/unimplemented property: ",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)__k);
                              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 ((ostream *)local_2f8,(char *)local_4b0,
                                                  local_4a8._0_8_);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                              if (local_4b0 != (undefined1  [8])(local_4a8 + 8)) {
                                operator_delete((void *)local_4b0,local_4a8._8_8_ + 1);
                              }
                              if ((string *)local_3e8._16_8_ != (string *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_4b0,&local_4f8,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)abStack_470._8_8_);
                                ::std::__cxx11::string::operator=
                                          ((string *)local_3e8._16_8_,(string *)local_4b0);
                                if (local_4b0 != (undefined1  [8])(local_4a8 + 8)) {
                                  operator_delete((void *)local_4b0,local_4a8._8_8_ + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                                  operator_delete(local_4f8._M_dataplus._M_p,
                                                  CONCAT62(local_4f8.field_2._M_allocated_capacity.
                                                           _2_6_,local_4f8.field_2.
                                                                 _M_allocated_capacity._0_2_) + 1);
                                }
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_2f8);
                              ::std::ios_base::~ios_base(local_288);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ((iVar7 != 3) && (iVar7 != 0)) break;
        p_Var11 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var11);
        local_440 = (pointer)CONCAT71((int7)((ulong)p_Var11 >> 8),
                                      p_Var11 == (_Rb_tree_node_base *)local_318._24_8_);
      } while (p_Var11 != (_Rb_tree_node_base *)local_318._24_8_);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3d0,(_Link_type)local_3d0._16_8_);
  return (bool)((byte)local_440 & 1);
}

Assistant:

bool ReconstructPrim(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomNurbsCurves *curves,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, curves, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "curveVertexCounts", GeomNurbsCurves,
                         curves->curveVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomNurbsCurves, curves->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomNurbsCurves,
                          curves->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomNurbsCurves,
                  curves->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomNurbsCurves,
                 curves->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomNurbsCurves, curves->widths)

    //
    PARSE_TYPED_ATTRIBUTE(table, prop, "order", GeomNurbsCurves, curves->order)
    PARSE_TYPED_ATTRIBUTE(table, prop, "knots", GeomNurbsCurves, curves->knots)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ranges", GeomNurbsCurves, curves->ranges)
    PARSE_TYPED_ATTRIBUTE(table, prop, "pointWeights", GeomNurbsCurves, curves->pointWeights)

    ADD_PROPERTY(table, prop, GeomBasisCurves, curves->props)

    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}